

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cpp
# Opt level: O3

void __thiscall sf2cute::SoundFontWriter::Write(SoundFontWriter *this,string *filename)

{
  long lVar1;
  ofstream out;
  long local_218;
  filebuf local_210 [20];
  undefined4 auStack_1fc [55];
  ios_base local_120 [264];
  
  std::ofstream::ofstream(&local_218);
  lVar1 = *(long *)(local_218 + -0x18);
  *(undefined4 *)((long)auStack_1fc + lVar1) = 5;
  std::ios::clear((int)&local_218 + (int)lVar1);
  std::ofstream::open((string *)&local_218,(_Ios_Openmode)filename);
  Write(this,(ostream *)&local_218);
  local_218 = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_210);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void SoundFontWriter::Write(const std::string & filename) {
  std::ofstream out;

  out.exceptions(std::ios::badbit | std::ios::failbit);
  out.open(filename, std::ios::binary);

  Write(out);
}